

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.h
# Opt level: O2

void __thiscall Minisat::Solver::shareViaCallback<Minisat::Clause>(Solver *this,Clause *v,int lbd)

{
  vector<int,_std::allocator<int>_> *this_00;
  int *piVar1;
  pointer piVar2;
  bool bVar3;
  int i;
  ulong uVar4;
  int i_1;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  bool bVar9;
  
  if (lbd <= this->core_lbd_cut) {
    uVar8 = SUB84(v->header,4) >> 2;
    if ((int)uVar8 <= this->share_clause_max_size) {
      bVar9 = this->learnCallback == (_func_void_void_ptr_int_ptr *)0x0;
      bVar3 = this->learnCallbackLimit < (int)uVar8;
      if (!bVar3 && !bVar9) {
        std::vector<int,_std::allocator<int>_>::resize
                  (&this->learnCallbackBuffer,((ulong)v->header >> 0x22) + 1);
        piVar1 = (this->learnCallbackBuffer).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        for (uVar4 = 0; uVar5 = (ulong)v->header >> 0x22, uVar4 < uVar5; uVar4 = uVar4 + 1) {
          uVar8 = *(uint *)(&v[1].header.field_0x0 + uVar4 * 4);
          uVar6 = (int)uVar8 >> 1;
          uVar7 = ~uVar6;
          if ((uVar8 & 1) == 0) {
            uVar7 = uVar6 + 1;
          }
          piVar1[uVar4] = uVar7;
        }
        piVar1[uVar5] = 0;
        (*this->learnCallback)(this->learnCallbackState,piVar1);
      }
      if (((this->share_parallel == true) &&
          (this->learnedClsCallback !=
           (_func_void_vector<int,_std::allocator<int>_>_ptr_int_void_ptr *)0x0)) &&
         ((SUB84(v->header,4) >> 2 < 3 || (lbd <= this->core_lbd_cut)))) {
        this_00 = &this->learnCallbackBuffer;
        std::vector<int,_std::allocator<int>_>::resize(this_00,(ulong)v->header >> 0x22);
        if (bVar3 || bVar9) {
          piVar2 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          for (uVar4 = 0; uVar4 < (ulong)v->header >> 0x22; uVar4 = uVar4 + 1) {
            uVar8 = *(uint *)(&v[1].header.field_0x0 + uVar4 * 4);
            uVar6 = (int)uVar8 >> 1;
            uVar7 = ~uVar6;
            if ((uVar8 & 1) == 0) {
              uVar7 = uVar6 + 1;
            }
            piVar2[uVar4] = uVar7;
          }
        }
        (*this->learnedClsCallback)(this_00,lbd,this->issuer);
        return;
      }
    }
  }
  return;
}

Assistant:

inline void Solver::shareViaCallback(const V &v, int lbd)
{
    if (lbd > core_lbd_cut) return;
    if (v.size() > share_clause_max_size) return;

    bool filled_buffer = false;

    if (learnCallback != 0 && v.size() <= learnCallbackLimit) {
        learnCallbackBuffer.resize(v.size() + 1);
        for (int i = 0; i < v.size(); i++) {
            Lit lit = v[i];
            learnCallbackBuffer[i] = sign(lit) ? -(var(lit) + 1) : (var(lit) + 1);
        }
        learnCallbackBuffer[v.size()] = 0;
        filled_buffer = true;
        learnCallback(learnCallbackState, &(learnCallbackBuffer[0]));
    }

    /* share only limited clauses in parallel solving! */
    if (share_parallel && learnedClsCallback != 0 && (v.size() < 3 || lbd <= core_lbd_cut)) {
        learnCallbackBuffer.resize(v.size());
        if (!filled_buffer) {
            for (int i = 0; i < v.size(); i++) {
                Lit lit = v[i];
                learnCallbackBuffer[i] = sign(lit) ? -(var(lit) + 1) : (var(lit) + 1);
            }
        }
        learnedClsCallback(learnCallbackBuffer, lbd, issuer);
    }
}